

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

size_t __thiscall
OpenMesh::PropertyT<float>::store(PropertyT<float> *this,ostream *_ostr,bool _swap)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  const_reference _v;
  size_t sVar3;
  ulong local_38;
  size_t i;
  size_t bytes;
  bool _swap_local;
  ostream *_ostr_local;
  PropertyT<float> *this_local;
  
  bVar1 = IO::is_streamable<std::vector<float,std::allocator<float>>>();
  if (bVar1) {
    this_local = (PropertyT<float> *)
                 IO::store<std::vector<float,std::allocator<float>>>(_ostr,&this->data_,_swap);
  }
  else {
    i = 0;
    local_38 = 0;
    while( true ) {
      iVar2 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xb])();
      if (CONCAT44(extraout_var,iVar2) <= local_38) break;
      _v = std::vector<float,_std::allocator<float>_>::operator[](&this->data_,local_38);
      sVar3 = IO::store<float>(_ostr,_v,_swap);
      i = sVar3 + i;
      local_38 = local_38 + 1;
    }
    this_local = (PropertyT<float> *)i;
  }
  return (size_t)this_local;
}

Assistant:

virtual size_t store( std::ostream& _ostr, bool _swap ) const
  {
    if ( IO::is_streamable<vector_type>() )
      return IO::store(_ostr, data_, _swap );
    size_t bytes = 0;
    for (size_t i=0; i<n_elements(); ++i)
      bytes += IO::store( _ostr, data_[i], _swap );
    return bytes;
  }